

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SET_OF.c
# Opt level: O0

asn_enc_rval_t *
SET_OF_encode_der(asn_TYPE_descriptor_t *td,void *ptr,int tag_mode,ber_tlv_tag_t tag,
                 asn_app_consume_bytes_f *cb,void *app_key)

{
  int iVar1;
  void *pvVar2;
  undefined8 *puVar3;
  int in_ECX;
  long *in_RDX;
  asn_TYPE_descriptor_t *in_RSI;
  asn_enc_rval_t *in_RDI;
  ber_tlv_tag_t in_R8D;
  asn_app_consume_bytes_f *in_R9;
  asn_enc_rval_t *erval;
  _el_buffer *encoded_el_1;
  _el_buffer *encoded_el;
  void *memb_ptr_1;
  void *memb_ptr;
  int edx;
  int ret;
  size_t max_encoded_len;
  ssize_t eels_count;
  _el_buffer *encoded_els;
  ssize_t encoding_size;
  size_t computed_size;
  asn_anonymous_set_ *list;
  der_type_encoder_f *der_encoder;
  asn_TYPE_descriptor_t *elm_type;
  asn_TYPE_member_t *elm;
  asn_enc_rval_t local_b8;
  long *local_a0;
  void *local_98;
  asn_enc_rval_t local_90;
  void *local_78;
  int local_70;
  int local_6c;
  ulong local_68;
  size_t local_60;
  void *local_58;
  ssize_t local_50;
  size_t local_48;
  long *local_40;
  der_type_encoder_f *local_38;
  asn_TYPE_descriptor_s *local_30;
  asn_TYPE_member_s *local_28;
  asn_app_consume_bytes_f *local_20;
  ber_tlv_tag_t local_18;
  int local_14;
  long *local_10;
  asn_TYPE_descriptor_t *local_8;
  
  local_28 = in_RSI->elements;
  local_30 = local_28->type;
  local_38 = local_30->der_encoder;
  local_48 = 0;
  local_50 = 0;
  local_60 = 0;
  local_68 = 1;
  local_40 = in_RDX;
  local_20 = in_R9;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_RDX;
  local_8 = in_RSI;
  ASN_DEBUG("Estimating size for SET OF %s",in_RSI->name);
  for (local_70 = 0; local_70 < (int)local_40[1]; local_70 = local_70 + 1) {
    local_78 = *(void **)(*local_40 + (long)local_70 * 8);
    if (local_78 != (void *)0x0) {
      (*local_38)(&local_90,local_30,local_78,0,local_28->tag,(asn_app_consume_bytes_f *)0x0,
                  (void *)0x0);
      in_RDI->encoded = local_90.encoded;
      in_RDI->failed_type = local_90.failed_type;
      in_RDI->structure_ptr = local_90.structure_ptr;
      if (in_RDI->encoded == -1) {
        return in_RDI;
      }
      local_48 = in_RDI->encoded + local_48;
      if (local_68 < (ulong)in_RDI->encoded) {
        local_68 = in_RDI->encoded;
      }
    }
  }
  local_50 = der_write_tags(local_8,local_48,local_14,1,local_18,local_20,erval);
  if (local_50 == -1) {
    in_RDI->encoded = -1;
    in_RDI->failed_type = local_8;
    in_RDI->structure_ptr = local_10;
  }
  else {
    local_48 = local_50 + local_48;
    if ((local_20 == (asn_app_consume_bytes_f *)0x0) || ((int)local_40[1] == 0)) {
      in_RDI->encoded = local_48;
      in_RDI->structure_ptr = (void *)0x0;
      in_RDI->failed_type = (asn_TYPE_descriptor_s *)0x0;
    }
    else {
      local_58 = malloc((long)(int)local_40[1] * 0x18);
      if (local_58 == (void *)0x0) {
        in_RDI->encoded = -1;
        in_RDI->failed_type = local_8;
        in_RDI->structure_ptr = local_10;
      }
      else {
        ASN_DEBUG("Encoding members of %s SET OF",local_8->name);
        for (local_70 = 0; local_70 < (int)local_40[1]; local_70 = local_70 + 1) {
          local_98 = *(void **)(*local_40 + (long)local_70 * 8);
          local_a0 = (long *)((long)local_58 + local_60 * 0x18);
          if (local_98 != (void *)0x0) {
            pvVar2 = malloc(local_68);
            *local_a0 = (long)pvVar2;
            if (*local_a0 == 0) {
              while (local_70 = local_70 + -1, -1 < local_70) {
                free(*(void **)((long)local_58 + (long)local_70 * 0x18));
              }
              free(local_58);
              in_RDI->encoded = -1;
              in_RDI->failed_type = local_8;
              in_RDI->structure_ptr = local_10;
              return in_RDI;
            }
            local_a0[1] = 0;
            local_a0[2] = local_68;
            (*local_38)(&local_b8,local_30,local_98,0,local_28->tag,_el_addbytes,local_a0);
            in_RDI->encoded = local_b8.encoded;
            in_RDI->failed_type = local_b8.failed_type;
            in_RDI->structure_ptr = local_b8.structure_ptr;
            if (in_RDI->encoded == -1) {
              for (; -1 < local_70; local_70 = local_70 + -1) {
                free(*(void **)((long)local_58 + (long)local_70 * 0x18));
              }
              free(local_58);
              return in_RDI;
            }
            local_50 = in_RDI->encoded + local_50;
            local_60 = local_60 + 1;
          }
        }
        qsort(local_58,local_60,0x18,_el_buf_cmp);
        local_6c = 0;
        for (local_70 = 0; (long)local_70 < (long)local_60; local_70 = local_70 + 1) {
          puVar3 = (undefined8 *)((long)local_58 + (long)local_70 * 0x18);
          if ((local_6c == 0) && (iVar1 = (*local_20)((void *)*puVar3,puVar3[1],erval), iVar1 < 0))
          {
            local_6c = -1;
          }
          free((void *)*puVar3);
        }
        free(local_58);
        if ((local_6c == 0) && (local_48 == local_50)) {
          in_RDI->encoded = local_48;
        }
        else {
          in_RDI->encoded = -1;
          in_RDI->failed_type = local_8;
          in_RDI->structure_ptr = local_10;
        }
        in_RDI->structure_ptr = (void *)0x0;
        in_RDI->failed_type = (asn_TYPE_descriptor_s *)0x0;
      }
    }
  }
  return in_RDI;
}

Assistant:

asn_enc_rval_t
SET_OF_encode_der(asn_TYPE_descriptor_t *td, void *ptr,
	int tag_mode, ber_tlv_tag_t tag,
	asn_app_consume_bytes_f *cb, void *app_key) {
	asn_TYPE_member_t *elm = td->elements;
	asn_TYPE_descriptor_t *elm_type = elm->type;
	der_type_encoder_f *der_encoder = elm_type->der_encoder;
	asn_anonymous_set_ *list = _A_SET_FROM_VOID(ptr);
	size_t computed_size = 0;
	ssize_t encoding_size = 0;
	struct _el_buffer *encoded_els;
	ssize_t eels_count = 0;
	size_t max_encoded_len = 1;
	asn_enc_rval_t erval;
	int ret;
	int edx;

	ASN_DEBUG("Estimating size for SET OF %s", td->name);

	/*
	 * Gather the length of the underlying members sequence.
	 */
	for(edx = 0; edx < list->count; edx++) {
		void *memb_ptr = list->array[edx];
		if(!memb_ptr) continue;
		erval = der_encoder(elm_type, memb_ptr, 0, elm->tag, 0, 0);
		if(erval.encoded == -1)
			return erval;
		computed_size += erval.encoded;

		/* Compute maximum encoding's size */
		if(max_encoded_len < (size_t)erval.encoded)
			max_encoded_len = erval.encoded;
	}

	/*
	 * Encode the TLV for the sequence itself.
	 */
	encoding_size = der_write_tags(td, computed_size, tag_mode, 1, tag,
		cb, app_key);
	if(encoding_size == -1) {
		erval.encoded = -1;
		erval.failed_type = td;
		erval.structure_ptr = ptr;
		return erval;
	}
	computed_size += encoding_size;

	if(!cb || list->count == 0) {
		erval.encoded = computed_size;
		ASN__ENCODED_OK(erval);
	}

	/*
	 * DER mandates dynamic sorting of the SET OF elements
	 * according to their encodings. Build an array of the
	 * encoded elements.
	 */
	encoded_els = (struct _el_buffer *)MALLOC(
				list->count * sizeof(encoded_els[0]));
	if(encoded_els == NULL) {
		erval.encoded = -1;
		erval.failed_type = td;
		erval.structure_ptr = ptr;
		return erval;
	}

	ASN_DEBUG("Encoding members of %s SET OF", td->name);

	/*
	 * Encode all members.
	 */
	for(edx = 0; edx < list->count; edx++) {
		void *memb_ptr = list->array[edx];
		struct _el_buffer *encoded_el = &encoded_els[eels_count];

		if(!memb_ptr) continue;

		/*
		 * Prepare space for encoding.
		 */
		encoded_el->buf = (uint8_t *)MALLOC(max_encoded_len);
		if(encoded_el->buf) {
			encoded_el->length = 0;
			encoded_el->size = max_encoded_len;
		} else {
			for(edx--; edx >= 0; edx--)
				FREEMEM(encoded_els[edx].buf);
			FREEMEM(encoded_els);
			erval.encoded = -1;
			erval.failed_type = td;
			erval.structure_ptr = ptr;
			return erval;
		}

		/*
		 * Encode the member into the prepared space.
		 */
		erval = der_encoder(elm_type, memb_ptr, 0, elm->tag,
			_el_addbytes, encoded_el);
		if(erval.encoded == -1) {
			for(; edx >= 0; edx--)
				FREEMEM(encoded_els[edx].buf);
			FREEMEM(encoded_els);
			return erval;
		}
		encoding_size += erval.encoded;
		eels_count++;
	}

	/*
	 * Sort the encoded elements according to their encoding.
	 */
	qsort(encoded_els, eels_count, sizeof(encoded_els[0]), _el_buf_cmp);

	/*
	 * Report encoded elements to the application.
	 * Dispose of temporary sorted members table.
	 */
	ret = 0;
	for(edx = 0; edx < eels_count; edx++) {
		struct _el_buffer *encoded_el = &encoded_els[edx];
		/* Report encoded chunks to the application */
		if(ret == 0
		&& cb(encoded_el->buf, encoded_el->length, app_key) < 0)
			ret = -1;
		FREEMEM(encoded_el->buf);
	}
	FREEMEM(encoded_els);

	if(ret || computed_size != (size_t)encoding_size) {
		/*
		 * Standard callback failed, or
		 * encoded size is not equal to the computed size.
		 */
		erval.encoded = -1;
		erval.failed_type = td;
		erval.structure_ptr = ptr;
	} else {
		erval.encoded = computed_size;
	}

	ASN__ENCODED_OK(erval);
}